

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrb.h
# Opt level: O2

ref<immutable::rrb_details::internal_node<int,_false>_> __thiscall
immutable::rrb_details::concat_sub_tree<int,false,6>
          (rrb_details *this,ref<immutable::rrb_details::tree_node<int,_false>_> *left_node,
          uint32_t left_shift,ref<immutable::rrb_details::tree_node<int,_false>_> *right_node,
          uint32_t right_shift,bool is_top)

{
  uint32_t uVar1;
  ref<immutable::rrb_details::internal_node<int,_false>_> *prVar2;
  internal_node<int,_false> *piVar3;
  leaf_node<int,_false> *plVar4;
  undefined7 in_register_00000089;
  ref<immutable::rrb_details::internal_node<int,_false>_> centre_node;
  ref<immutable::rrb_details::internal_node<int,_false>_> left_internal;
  ref<immutable::rrb_details::tree_node<int,_false>_> left_node_temp;
  ref<immutable::rrb_details::internal_node<int,_false>_> empty;
  ref<immutable::rrb_details::internal_node<int,_false>_> centre_node_2;
  ref<immutable::rrb_details::internal_node<int,_false>_> local_60;
  ref<immutable::rrb_details::internal_node<int,_false>_> local_58;
  ref<immutable::rrb_details::internal_node<int,_false>_> local_50;
  ref<immutable::rrb_details::internal_node<int,_false>_> local_48;
  ref<immutable::rrb_details::internal_node<int,_false>_> local_40;
  undefined4 local_34;
  
  if (right_shift < left_shift) {
    local_34 = (undefined4)CONCAT71(in_register_00000089,is_top);
    local_58.ptr = (internal_node<int,_false> *)left_node->ptr;
    if (local_58.ptr != (internal_node<int,_false> *)0x0) {
      (local_58.ptr)->_ref_count = (local_58.ptr)->_ref_count + 1;
    }
    piVar3 = ref<immutable::rrb_details::internal_node<int,_false>_>::operator->(&local_58);
    prVar2 = piVar3->child;
    piVar3 = ref<immutable::rrb_details::internal_node<int,_false>_>::operator->(&local_58);
    local_50.ptr = prVar2[piVar3->len - 1].ptr;
    if (local_50.ptr != (internal_node<int,_false> *)0x0) {
      (local_50.ptr)->_ref_count = (local_50.ptr)->_ref_count + 1;
    }
    concat_sub_tree<int,false,6>
              ((rrb_details *)&local_60,
               (ref<immutable::rrb_details::tree_node<int,_false>_> *)&local_50,left_shift - 6,
               right_node,right_shift,false);
    local_48.ptr = (internal_node<int,_false> *)0x0;
    rebalance<int,false,6>(this,&local_58,&local_60,&local_48,left_shift,local_34._0_1_);
  }
  else {
    if (right_shift <= left_shift) {
      if (left_shift == 0) {
        local_60.ptr = (internal_node<int,_false> *)left_node->ptr;
        if (local_60.ptr != (internal_node<int,_false> *)0x0) {
          (local_60.ptr)->_ref_count = (local_60.ptr)->_ref_count + 1;
        }
        local_50.ptr = (internal_node<int,_false> *)right_node->ptr;
        if (local_50.ptr != (internal_node<int,_false> *)0x0) {
          (local_50.ptr)->_ref_count = (local_50.ptr)->_ref_count + 1;
        }
        local_58.ptr = local_60.ptr;
        if (is_top) {
          plVar4 = ref<immutable::rrb_details::leaf_node<int,_false>_>::operator->
                             ((ref<immutable::rrb_details::leaf_node<int,_false>_> *)&local_58);
          uVar1 = plVar4->len;
          plVar4 = ref<immutable::rrb_details::leaf_node<int,_false>_>::operator->
                             ((ref<immutable::rrb_details::leaf_node<int,_false>_> *)&local_50);
          if (uVar1 + plVar4->len < 0x41) {
            local_60.ptr = (internal_node<int,_false> *)
                           leaf_node_merge<int,false>(local_58.ptr,local_50.ptr);
            if (local_60.ptr != (internal_node<int,_false> *)0x0) {
              (local_60.ptr)->_ref_count = 1;
            }
            piVar3 = internal_node_new_above1<int,false>(&local_60);
            *(internal_node<int,_false> **)this = piVar3;
            if (piVar3 != (internal_node<int,_false> *)0x0) {
              piVar3->_ref_count = 1;
            }
            goto LAB_00145c63;
          }
          local_60.ptr = (internal_node<int,_false> *)left_node->ptr;
        }
        if (local_60.ptr != (internal_node<int,_false> *)0x0) {
          (local_60.ptr)->_ref_count = (local_60.ptr)->_ref_count + 1;
        }
        local_48.ptr = (internal_node<int,_false> *)right_node->ptr;
        if (local_48.ptr != (internal_node<int,_false> *)0x0) {
          (local_48.ptr)->_ref_count = (local_48.ptr)->_ref_count + 1;
        }
        piVar3 = internal_node_new_above<int,false>(&local_60,&local_48);
        *(internal_node<int,_false> **)this = piVar3;
        if (piVar3 != (internal_node<int,_false> *)0x0) {
          piVar3->_ref_count = 1;
        }
        ref<immutable::rrb_details::internal_node<int,_false>_>::~ref(&local_48);
LAB_00145c63:
        ref<immutable::rrb_details::internal_node<int,_false>_>::~ref(&local_60);
        release<int>((leaf_node<int,_false> *)local_50.ptr);
        release<int>((leaf_node<int,_false> *)local_58.ptr);
        return (ref<immutable::rrb_details::internal_node<int,_false>_>)
               (internal_node<int,_false> *)this;
      }
      local_58.ptr = (internal_node<int,_false> *)left_node->ptr;
      if (local_58.ptr != (internal_node<int,_false> *)0x0) {
        (local_58.ptr)->_ref_count = (local_58.ptr)->_ref_count + 1;
      }
      local_50.ptr = (internal_node<int,_false> *)right_node->ptr;
      if (local_50.ptr != (internal_node<int,_false> *)0x0) {
        (local_50.ptr)->_ref_count = (local_50.ptr)->_ref_count + 1;
      }
      piVar3 = ref<immutable::rrb_details::internal_node<int,_false>_>::operator->(&local_58);
      prVar2 = piVar3->child;
      piVar3 = ref<immutable::rrb_details::internal_node<int,_false>_>::operator->(&local_58);
      local_60.ptr = prVar2[piVar3->len - 1].ptr;
      if (local_60.ptr != (internal_node<int,_false> *)0x0) {
        (local_60.ptr)->_ref_count = (local_60.ptr)->_ref_count + 1;
      }
      piVar3 = ref<immutable::rrb_details::internal_node<int,_false>_>::operator->(&local_50);
      local_48.ptr = piVar3->child->ptr;
      if (local_48.ptr != (internal_node<int,_false> *)0x0) {
        (local_48.ptr)->_ref_count = (local_48.ptr)->_ref_count + 1;
      }
      concat_sub_tree<int,false,6>
                ((rrb_details *)&local_40,
                 (ref<immutable::rrb_details::tree_node<int,_false>_> *)&local_60,left_shift - 6,
                 (ref<immutable::rrb_details::tree_node<int,_false>_> *)&local_48,right_shift - 6,
                 false);
      rebalance<int,false,6>(this,&local_58,&local_40,&local_50,left_shift,is_top);
      ref<immutable::rrb_details::internal_node<int,_false>_>::~ref(&local_40);
      ref<immutable::rrb_details::tree_node<int,_false>_>::~ref
                ((ref<immutable::rrb_details::tree_node<int,_false>_> *)&local_48);
      ref<immutable::rrb_details::tree_node<int,_false>_>::~ref
                ((ref<immutable::rrb_details::tree_node<int,_false>_> *)&local_60);
      ref<immutable::rrb_details::internal_node<int,_false>_>::~ref(&local_50);
      goto LAB_00145a88;
    }
    local_58.ptr = (internal_node<int,_false> *)right_node->ptr;
    if (local_58.ptr != (internal_node<int,_false> *)0x0) {
      (local_58.ptr)->_ref_count = (local_58.ptr)->_ref_count + 1;
    }
    piVar3 = ref<immutable::rrb_details::internal_node<int,_false>_>::operator->(&local_58);
    local_50.ptr = piVar3->child->ptr;
    if (local_50.ptr != (internal_node<int,_false> *)0x0) {
      (local_50.ptr)->_ref_count = (local_50.ptr)->_ref_count + 1;
    }
    concat_sub_tree<int,false,6>
              ((rrb_details *)&local_60,left_node,left_shift,
               (ref<immutable::rrb_details::tree_node<int,_false>_> *)&local_50,right_shift - 6,
               false);
    local_48.ptr = (internal_node<int,_false> *)0x0;
    rebalance<int,false,6>(this,&local_48,&local_60,&local_58,right_shift,is_top);
  }
  ref<immutable::rrb_details::internal_node<int,_false>_>::~ref(&local_48);
  ref<immutable::rrb_details::internal_node<int,_false>_>::~ref(&local_60);
  ref<immutable::rrb_details::tree_node<int,_false>_>::~ref
            ((ref<immutable::rrb_details::tree_node<int,_false>_> *)&local_50);
LAB_00145a88:
  ref<immutable::rrb_details::internal_node<int,_false>_>::~ref(&local_58);
  return (ref<immutable::rrb_details::internal_node<int,_false>_>)(internal_node<int,_false> *)this;
}

Assistant:

inline ref<internal_node<T, atomic_ref_counting>> concat_sub_tree(const ref<tree_node<T, atomic_ref_counting>>& left_node, uint32_t left_shift, const ref<tree_node<T, atomic_ref_counting>>& right_node, uint32_t right_shift, bool is_top)
      {
      if (left_shift > right_shift)
        {
        // Left tree is higher than right tree
        ref<internal_node<T, atomic_ref_counting>> left_internal = left_node;
        ref<tree_node<T, atomic_ref_counting>> left_node_temp = left_internal->child[left_internal->len - 1];
        ref<internal_node<T, atomic_ref_counting>> centre_node = concat_sub_tree<T, atomic_ref_counting, N>(left_node_temp, left_shift - bits<N>::rrb_bits, right_node, right_shift, false);
        ref<internal_node<T, atomic_ref_counting>> empty(nullptr);
        return rebalance<T, atomic_ref_counting, N>(left_internal, centre_node, empty, left_shift, is_top);
        }
      else if (left_shift < right_shift)
        {
        ref<internal_node<T, atomic_ref_counting>> right_internal = right_node;
        ref<tree_node<T, atomic_ref_counting>> right_node_temp = right_internal->child[0];
        ref<internal_node<T, atomic_ref_counting>> centre_node = concat_sub_tree<T, atomic_ref_counting, N>(left_node, left_shift, right_node_temp, right_shift - bits<N>::rrb_bits, false);
        ref<internal_node<T, atomic_ref_counting>> empty(nullptr);
        return rebalance<T, atomic_ref_counting, N>(empty, centre_node, right_internal, right_shift, is_top);
        }
      else
        { // we have same height
        if (left_shift == 0)
          { // We're dealing with leaf nodes
          ref<leaf_node<T, atomic_ref_counting>> left_leaf = left_node;
          ref<leaf_node<T, atomic_ref_counting>> right_leaf = right_node;
          // We don't do this if we're not at top, as we'd have to zip stuff above
          // as well.
          if (is_top && (left_leaf->len + right_leaf->len) <= bits<N>::rrb_branching)
            {
            // Can put them in a single node
            ref<internal_node<T, atomic_ref_counting>> merged = leaf_node_merge<T, atomic_ref_counting>(left_leaf.ptr, right_leaf.ptr);
            return internal_node_new_above1(merged);
            }
          else
            {
            ref<internal_node<T, atomic_ref_counting>> left_internal = left_node;
            ref<internal_node<T, atomic_ref_counting>> right_internal = right_node;
            return internal_node_new_above(left_internal, right_internal);
            }
          }
        else
          { // two internal nodes with same height. Move both down
          ref<internal_node<T, atomic_ref_counting>> left_internal = left_node;
          ref<internal_node<T, atomic_ref_counting>> right_internal = right_node;
          ref<tree_node<T, atomic_ref_counting>> left_node_temp = left_internal->child[left_internal->len - 1];
          ref<tree_node<T, atomic_ref_counting>> right_node_temp = right_internal->child[0];
          ref<internal_node<T, atomic_ref_counting>> centre_node = concat_sub_tree<T, atomic_ref_counting, N>(left_node_temp, left_shift - bits<N>::rrb_bits, right_node_temp, right_shift - bits<N>::rrb_bits, false);
          // can be optimised: since left_shift == right_shift, we'll end up in this
          // block again.
          return rebalance<T, atomic_ref_counting, N>(left_internal, centre_node, right_internal, left_shift, is_top);
          }
        }
      }